

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlValidateOneElement(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem)

{
  uint uVar1;
  int iVar2;
  xmlChar **str2;
  bool bVar3;
  xmlChar *local_e0;
  xmlNsPtr ns_3;
  xmlNsPtr ns_2;
  xmlNsPtr nameSpace;
  xmlAttrPtr attrib;
  xmlNsPtr ns_1;
  xmlNsPtr ns;
  byte *pbStack_a8;
  int qualified;
  xmlChar *content;
  xmlChar *fullname;
  xmlChar fn [50];
  int local_5c;
  xmlChar *pxStack_58;
  int extsubset;
  xmlChar *name;
  int tmp;
  int ret;
  xmlNodePtr child;
  xmlAttributePtr attr;
  xmlElementContentPtr cont;
  xmlElementPtr elemDecl;
  xmlNodePtr elem_local;
  xmlDocPtr doc_local;
  xmlValidCtxtPtr ctxt_local;
  
  cont = (xmlElementContentPtr)0x0;
  name._4_4_ = 1;
  local_5c = 0;
  if (doc == (xmlDocPtr)0x0) {
    return 0;
  }
  if ((doc->intSubset == (_xmlDtd *)0x0) && (doc->extSubset == (_xmlDtd *)0x0)) {
    return 0;
  }
  if (elem == (xmlNodePtr)0x0) {
    return 0;
  }
  uVar1 = elem->type - XML_ELEMENT_NODE;
  elemDecl = (xmlElementPtr)elem;
  elem_local = (xmlNodePtr)doc;
  doc_local = (xmlDocPtr)ctxt;
  if (uVar1 < 0x13 || elem->type == XML_XINCLUDE_END) {
    switch((long)&switchD_001d63a7::switchdataD_002755dc +
           (long)(int)(&switchD_001d63a7::switchdataD_002755dc)[uVar1]) {
    case 0x1d63a9:
      xmlErrValidNode(ctxt,elem,XML_ERR_INTERNAL_ERROR,"Attribute element not expected\n",
                      (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
      ctxt_local._4_4_ = 0;
      break;
    case 0x1d63de:
      if (elem->children == (_xmlNode *)0x0) {
        if (elem->ns == (xmlNs *)0x0) {
          if (elem->content == (xmlChar *)0x0) {
            xmlErrValidNode(ctxt,elem,XML_ERR_INTERNAL_ERROR,"Text element has no content !\n",
                            (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
            ctxt_local._4_4_ = 0;
          }
          else {
            ctxt_local._4_4_ = 1;
          }
        }
        else {
          xmlErrValidNode(ctxt,elem,XML_ERR_INTERNAL_ERROR,"Text element has namespace !\n",
                          (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
          ctxt_local._4_4_ = 0;
        }
      }
      else {
        xmlErrValidNode(ctxt,elem,XML_ERR_INTERNAL_ERROR,"Text element has children !\n",
                        (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
        ctxt_local._4_4_ = 0;
      }
      break;
    case 0x1d64aa:
      ctxt_local._4_4_ = 1;
      break;
    case 0x1d64b6:
      ctxt_local._4_4_ = 1;
      break;
    case 0x1d64c2:
      xmlErrValidNode(ctxt,elem,XML_ERR_INTERNAL_ERROR,"Entity element not expected\n",
                      (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
      ctxt_local._4_4_ = 0;
      break;
    case 0x1d64f7:
      xmlErrValidNode(ctxt,elem,XML_ERR_INTERNAL_ERROR,"Notation element not expected\n",
                      (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
      ctxt_local._4_4_ = 0;
      break;
    case 0x1d652c:
      xmlErrValidNode(ctxt,elem,XML_ERR_INTERNAL_ERROR,"Document element not expected\n",
                      (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
      ctxt_local._4_4_ = 0;
      break;
    case 0x1d6561:
      xmlErrValidNode(ctxt,elem,XML_ERR_INTERNAL_ERROR,"HTML Document not expected\n",(xmlChar *)0x0
                      ,(xmlChar *)0x0,(xmlChar *)0x0);
      ctxt_local._4_4_ = 0;
      break;
    case 0x1d6596:
      cont = (xmlElementContentPtr)xmlValidGetElemDecl(ctxt,doc,elem,&local_5c);
      if ((xmlElementPtr)cont == (xmlElementPtr)0x0) {
        ctxt_local._4_4_ = 0;
      }
      else {
        if (*(int *)&doc_local->intSubset == 0) {
          switch(((xmlElementPtr)cont)->etype) {
          case XML_ELEMENT_TYPE_UNDEFINED:
            xmlErrValidNode((xmlValidCtxtPtr)doc_local,(xmlNodePtr)elemDecl,XML_DTD_UNKNOWN_ELEM,
                            "No declaration for element %s\n",elemDecl->name,(xmlChar *)0x0,
                            (xmlChar *)0x0);
            return 0;
          case XML_ELEMENT_TYPE_EMPTY:
            if (elemDecl->children != (_xmlNode *)0x0) {
              xmlErrValidNode((xmlValidCtxtPtr)doc_local,(xmlNodePtr)elemDecl,XML_DTD_NOT_EMPTY,
                              "Element %s was declared EMPTY this one has content\n",elemDecl->name,
                              (xmlChar *)0x0,(xmlChar *)0x0);
              name._4_4_ = 0;
            }
            break;
          case XML_ELEMENT_TYPE_ANY:
            break;
          case XML_ELEMENT_TYPE_MIXED:
            if ((((xmlElementPtr)cont)->content == (xmlElementContentPtr)0x0) ||
               (((xmlElementPtr)cont)->content->type != XML_ELEMENT_CONTENT_PCDATA)) {
              for (_tmp = elemDecl->children; _tmp != (xmlNodePtr)0x0; _tmp = _tmp->next) {
                if (_tmp->type == XML_ELEMENT_NODE) {
                  pxStack_58 = _tmp->name;
                  if ((_tmp->ns != (xmlNs *)0x0) && (_tmp->ns->prefix != (xmlChar *)0x0)) {
                    str2 = (xmlChar **)
                           xmlBuildQName(_tmp->name,_tmp->ns->prefix,(xmlChar *)&fullname,0x32);
                    if (str2 == (xmlChar **)0x0) {
                      return 0;
                    }
                    for (attr = (xmlAttributePtr)cont[1].parent; attr != (xmlAttributePtr)0x0;
                        attr = (xmlAttributePtr)attr->children) {
                      if (*(int *)&attr->_private == 2) {
                        iVar2 = xmlStrEqual(*(xmlChar **)&attr->type,(xmlChar *)str2);
joined_r0x001d6833:
                        if (iVar2 != 0) break;
                      }
                      else {
                        if (((*(int *)&attr->_private == 4) && (attr->name != (xmlChar *)0x0)) &&
                           (*(int *)attr->name == 2)) {
                          iVar2 = xmlStrEqual(*(xmlChar **)(attr->name + 8),(xmlChar *)str2);
                          goto joined_r0x001d6833;
                        }
                        if (((*(int *)&attr->_private != 4) || (attr->name == (xmlChar *)0x0)) ||
                           (*(int *)attr->name != 1)) {
                          xmlErrValid((xmlValidCtxtPtr)0x0,XML_DTD_MIXED_CORRUPT,
                                      "Internal: MIXED struct corrupted\n",(char *)0x0);
                          break;
                        }
                      }
                    }
                    if ((str2 != &fullname) && (str2 != (xmlChar **)_tmp->name)) {
                      (*xmlFree)(str2);
                    }
                    if (attr != (xmlAttributePtr)0x0) goto LAB_001d69dc;
                  }
                  for (attr = (xmlAttributePtr)cont[1].parent; attr != (xmlAttributePtr)0x0;
                      attr = (xmlAttributePtr)attr->children) {
                    if (*(int *)&attr->_private == 2) {
                      iVar2 = xmlStrEqual(*(xmlChar **)&attr->type,pxStack_58);
joined_r0x001d6944:
                      if (iVar2 != 0) break;
                    }
                    else {
                      if (((*(int *)&attr->_private == 4) && (attr->name != (xmlChar *)0x0)) &&
                         (*(int *)attr->name == 2)) {
                        iVar2 = xmlStrEqual(*(xmlChar **)(attr->name + 8),pxStack_58);
                        goto joined_r0x001d6944;
                      }
                      if (((*(int *)&attr->_private != 4) || (attr->name == (xmlChar *)0x0)) ||
                         (*(int *)attr->name != 1)) {
                        xmlErrValid((xmlValidCtxtPtr)doc_local,XML_DTD_MIXED_CORRUPT,
                                    "Internal: MIXED struct corrupted\n",(char *)0x0);
                        break;
                      }
                    }
                  }
                  if (attr == (xmlAttributePtr)0x0) {
                    xmlErrValidNode((xmlValidCtxtPtr)doc_local,(xmlNodePtr)elemDecl,
                                    XML_DTD_INVALID_CHILD,
                                    "Element %s is not declared in %s list of possible children\n",
                                    pxStack_58,elemDecl->name,(xmlChar *)0x0);
                    name._4_4_ = 0;
                  }
                }
LAB_001d69dc:
              }
            }
            else {
              name._4_4_ = xmlValidateOneCdataElement
                                     ((xmlValidCtxtPtr)doc_local,(xmlDocPtr)elem_local,
                                      (xmlNodePtr)elemDecl);
              if (name._4_4_ == 0) {
                xmlErrValidNode((xmlValidCtxtPtr)doc_local,(xmlNodePtr)elemDecl,XML_DTD_NOT_PCDATA,
                                "Element %s was declared #PCDATA but contains non text nodes\n",
                                elemDecl->name,(xmlChar *)0x0,(xmlChar *)0x0);
              }
            }
            break;
          case XML_ELEMENT_TYPE_ELEMENT:
            if ((*(int *)((long)&elem_local->ns + 4) == 1) && (local_5c == 1)) {
              for (_tmp = elemDecl->children; _tmp != (_xmlNode *)0x0; _tmp = _tmp->next) {
                if (_tmp->type == XML_TEXT_NODE) {
                  pbStack_a8 = _tmp->content;
                  while( true ) {
                    bVar3 = true;
                    if ((*pbStack_a8 != 0x20) &&
                       ((*pbStack_a8 < 9 || (bVar3 = true, 10 < *pbStack_a8)))) {
                      bVar3 = *pbStack_a8 == 0xd;
                    }
                    if (!bVar3) break;
                    pbStack_a8 = pbStack_a8 + 1;
                  }
                  if (*pbStack_a8 == 0) {
                    xmlErrValidNode((xmlValidCtxtPtr)doc_local,(xmlNodePtr)elemDecl,
                                    XML_DTD_STANDALONE_WHITE_SPACE,
                                    "standalone: %s declared in the external subset contains white spaces nodes\n"
                                    ,elemDecl->name,(xmlChar *)0x0,(xmlChar *)0x0);
                    name._4_4_ = 0;
                    break;
                  }
                }
              }
            }
            _tmp = elemDecl->children;
            attr = (xmlAttributePtr)cont[1].parent;
            name._0_4_ = xmlValidateElementContent
                                   ((xmlValidCtxtPtr)doc_local,_tmp,(xmlElementPtr)cont,1,
                                    (xmlNodePtr)elemDecl);
            if ((int)name < 1) {
              name._4_4_ = (int)name;
            }
          }
        }
        for (child = (xmlNodePtr)cont[1].prefix; child != (xmlNodePtr)0x0;
            child = (xmlNodePtr)child->ns) {
          if (*(int *)((long)&child->content + 4) == 2) {
            ns._4_4_ = -1;
            if ((child->psvi == (void *)0x0) &&
               (iVar2 = xmlStrEqual(child->name,"xmlns"), iVar2 != 0)) {
              for (ns_1 = (xmlNsPtr)elemDecl->prefix; ns_1 != (xmlNsPtr)0x0; ns_1 = ns_1->next) {
                if (ns_1->prefix == (xmlChar *)0x0) goto LAB_001d700e;
              }
            }
            else {
              iVar2 = xmlStrEqual((xmlChar *)child->psvi,"xmlns");
              if (iVar2 == 0) {
                for (nameSpace = (xmlNsPtr)elemDecl->attributes; nameSpace != (xmlNsPtr)0x0;
                    nameSpace = nameSpace[1].next) {
                  iVar2 = xmlStrEqual(nameSpace->href,child->name);
                  if (iVar2 != 0) {
                    if (child->psvi == (void *)0x0) goto LAB_001d700e;
                    ns_2 = (xmlNsPtr)nameSpace[1].prefix;
                    if (ns_2 == (xmlNsPtr)0x0) {
                      ns_2 = *(xmlNsPtr *)&elemDecl->etype;
                    }
                    if (ns_2 == (xmlNsPtr)0x0) {
                      if (ns._4_4_ < 0) {
                        ns._4_4_ = 0;
                      }
                    }
                    else {
                      iVar2 = xmlStrEqual(ns_2->prefix,(xmlChar *)child->psvi);
                      if (iVar2 != 0) goto LAB_001d700e;
                      if (ns._4_4_ < 1) {
                        ns._4_4_ = 1;
                      }
                    }
                  }
                }
              }
              else {
                for (attrib = (xmlAttrPtr)elemDecl->prefix; attrib != (xmlAttrPtr)0x0;
                    attrib = (xmlAttrPtr)attrib->_private) {
                  iVar2 = xmlStrEqual(child->name,(xmlChar *)attrib->children);
                  if (iVar2 != 0) goto LAB_001d700e;
                }
              }
            }
            if (ns._4_4_ == -1) {
              if (child->psvi == (void *)0x0) {
                xmlErrValidNode((xmlValidCtxtPtr)doc_local,(xmlNodePtr)elemDecl,
                                XML_DTD_MISSING_ATTRIBUTE,"Element %s does not carry attribute %s\n"
                                ,elemDecl->name,child->name,(xmlChar *)0x0);
              }
              else {
                xmlErrValidNode((xmlValidCtxtPtr)doc_local,(xmlNodePtr)elemDecl,
                                XML_DTD_MISSING_ATTRIBUTE,
                                "Element %s does not carry attribute %s:%s\n",elemDecl->name,
                                (xmlChar *)child->psvi,child->name);
              }
              name._4_4_ = 0;
            }
            else if (ns._4_4_ == 0) {
              xmlErrValidWarning((xmlValidCtxtPtr)doc_local,(xmlNodePtr)elemDecl,XML_DTD_NO_PREFIX,
                                 "Element %s required attribute %s:%s has no prefix\n",
                                 elemDecl->name,(xmlChar *)child->psvi,child->name);
            }
            else if (ns._4_4_ == 1) {
              xmlErrValidWarning((xmlValidCtxtPtr)doc_local,(xmlNodePtr)elemDecl,
                                 XML_DTD_DIFFERENT_PREFIX,
                                 "Element %s required attribute %s:%s has different prefix\n",
                                 elemDecl->name,(xmlChar *)child->psvi,child->name);
            }
          }
          else if (*(int *)((long)&child->content + 4) == 4) {
            if ((child->psvi == (void *)0x0) &&
               (iVar2 = xmlStrEqual(child->name,"xmlns"), iVar2 != 0)) {
              for (ns_3 = (xmlNsPtr)elemDecl->prefix; ns_3 != (xmlNsPtr)0x0; ns_3 = ns_3->next) {
                if (ns_3->prefix == (xmlChar *)0x0) {
                  iVar2 = xmlStrEqual((xmlChar *)child->properties,ns_3->href);
                  if (iVar2 == 0) {
                    xmlErrValidNode((xmlValidCtxtPtr)doc_local,(xmlNodePtr)elemDecl,
                                    XML_DTD_ELEM_DEFAULT_NAMESPACE,
                                    "Element %s namespace name for default namespace does not match the DTD\n"
                                    ,elemDecl->name,(xmlChar *)0x0,(xmlChar *)0x0);
                    name._4_4_ = 0;
                  }
                  break;
                }
              }
            }
            else {
              iVar2 = xmlStrEqual((xmlChar *)child->psvi,"xmlns");
              if (iVar2 != 0) {
                for (local_e0 = elemDecl->prefix; local_e0 != (xmlChar *)0x0;
                    local_e0 = *(xmlChar **)local_e0) {
                  iVar2 = xmlStrEqual(child->name,*(xmlChar **)(local_e0 + 0x18));
                  if (iVar2 != 0) {
                    iVar2 = xmlStrEqual((xmlChar *)child->properties,*(xmlChar **)(local_e0 + 0x10))
                    ;
                    if (iVar2 == 0) {
                      xmlErrValidNode((xmlValidCtxtPtr)doc_local,(xmlNodePtr)elemDecl,
                                      XML_DTD_ELEM_NAMESPACE,
                                      "Element %s namespace name for %s does not match the DTD\n",
                                      elemDecl->name,*(xmlChar **)(local_e0 + 0x18),(xmlChar *)0x0);
                      name._4_4_ = 0;
                    }
                    break;
                  }
                }
              }
            }
          }
LAB_001d700e:
        }
        ctxt_local._4_4_ = name._4_4_;
      }
      break;
    case 0x1d6598:
      goto switchD_001d63a7_caseD_1d6598;
    }
  }
  else {
switchD_001d63a7_caseD_1d6598:
    xmlErrValidNode(ctxt,elem,XML_ERR_INTERNAL_ERROR,"unknown element type\n",(xmlChar *)0x0,
                    (xmlChar *)0x0,(xmlChar *)0x0);
    ctxt_local._4_4_ = 0;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlValidateOneElement(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                      xmlNodePtr elem) {
    xmlElementPtr elemDecl = NULL;
    xmlElementContentPtr cont;
    xmlAttributePtr attr;
    xmlNodePtr child;
    int ret = 1, tmp;
    const xmlChar *name;
    int extsubset = 0;

    CHECK_DTD;

    if (elem == NULL) return(0);
    switch (elem->type) {
        case XML_ATTRIBUTE_NODE:
	    xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		   "Attribute element not expected\n", NULL, NULL ,NULL);
	    return(0);
        case XML_TEXT_NODE:
	    if (elem->children != NULL) {
		xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		                "Text element has children !\n",
				NULL,NULL,NULL);
		return(0);
	    }
	    if (elem->ns != NULL) {
		xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		                "Text element has namespace !\n",
				NULL,NULL,NULL);
		return(0);
	    }
	    if (elem->content == NULL) {
		xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		                "Text element has no content !\n",
				NULL,NULL,NULL);
		return(0);
	    }
	    return(1);
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
            return(1);
        case XML_CDATA_SECTION_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
	    return(1);
        case XML_ENTITY_NODE:
	    xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		   "Entity element not expected\n", NULL, NULL ,NULL);
	    return(0);
        case XML_NOTATION_NODE:
	    xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		   "Notation element not expected\n", NULL, NULL ,NULL);
	    return(0);
        case XML_DOCUMENT_NODE:
        case XML_DOCUMENT_TYPE_NODE:
        case XML_DOCUMENT_FRAG_NODE:
	    xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		   "Document element not expected\n", NULL, NULL ,NULL);
	    return(0);
        case XML_HTML_DOCUMENT_NODE:
	    xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		   "HTML Document not expected\n", NULL, NULL ,NULL);
	    return(0);
        case XML_ELEMENT_NODE:
	    break;
	default:
	    xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		   "unknown element type\n", NULL, NULL ,NULL);
	    return(0);
    }

    /*
     * Fetch the declaration
     */
    elemDecl = xmlValidGetElemDecl(ctxt, doc, elem, &extsubset);
    if (elemDecl == NULL)
	return(0);

    /*
     * If vstateNr is not zero that means continuous validation is
     * activated, do not try to check the content model at that level.
     */
    if (ctxt->vstateNr == 0) {
    /* Check that the element content matches the definition */
    switch (elemDecl->etype) {
        case XML_ELEMENT_TYPE_UNDEFINED:
	    xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_ELEM,
	                    "No declaration for element %s\n",
		   elem->name, NULL, NULL);
	    return(0);
        case XML_ELEMENT_TYPE_EMPTY:
	    if (elem->children != NULL) {
		xmlErrValidNode(ctxt, elem, XML_DTD_NOT_EMPTY,
	       "Element %s was declared EMPTY this one has content\n",
	               elem->name, NULL, NULL);
		ret = 0;
	    }
	    break;
        case XML_ELEMENT_TYPE_ANY:
	    /* I don't think anything is required then */
	    break;
        case XML_ELEMENT_TYPE_MIXED:

	    /* simple case of declared as #PCDATA */
	    if ((elemDecl->content != NULL) &&
		(elemDecl->content->type == XML_ELEMENT_CONTENT_PCDATA)) {
		ret = xmlValidateOneCdataElement(ctxt, doc, elem);
		if (!ret) {
		    xmlErrValidNode(ctxt, elem, XML_DTD_NOT_PCDATA,
	       "Element %s was declared #PCDATA but contains non text nodes\n",
			   elem->name, NULL, NULL);
		}
		break;
	    }
	    child = elem->children;
	    /* Hum, this start to get messy */
	    while (child != NULL) {
	        if (child->type == XML_ELEMENT_NODE) {
		    name = child->name;
		    if ((child->ns != NULL) && (child->ns->prefix != NULL)) {
			xmlChar fn[50];
			xmlChar *fullname;

			fullname = xmlBuildQName(child->name, child->ns->prefix,
				                 fn, 50);
			if (fullname == NULL)
			    return(0);
			cont = elemDecl->content;
			while (cont != NULL) {
			    if (cont->type == XML_ELEMENT_CONTENT_ELEMENT) {
				if (xmlStrEqual(cont->name, fullname))
				    break;
			    } else if ((cont->type == XML_ELEMENT_CONTENT_OR) &&
			       (cont->c1 != NULL) &&
			       (cont->c1->type == XML_ELEMENT_CONTENT_ELEMENT)){
				if (xmlStrEqual(cont->c1->name, fullname))
				    break;
			    } else if ((cont->type != XML_ELEMENT_CONTENT_OR) ||
				(cont->c1 == NULL) ||
				(cont->c1->type != XML_ELEMENT_CONTENT_PCDATA)){
				xmlErrValid(NULL, XML_DTD_MIXED_CORRUPT,
					"Internal: MIXED struct corrupted\n",
					NULL);
				break;
			    }
			    cont = cont->c2;
			}
			if ((fullname != fn) && (fullname != child->name))
			    xmlFree(fullname);
			if (cont != NULL)
			    goto child_ok;
		    }
		    cont = elemDecl->content;
		    while (cont != NULL) {
		        if (cont->type == XML_ELEMENT_CONTENT_ELEMENT) {
			    if (xmlStrEqual(cont->name, name)) break;
			} else if ((cont->type == XML_ELEMENT_CONTENT_OR) &&
			   (cont->c1 != NULL) &&
			   (cont->c1->type == XML_ELEMENT_CONTENT_ELEMENT)) {
			    if (xmlStrEqual(cont->c1->name, name)) break;
			} else if ((cont->type != XML_ELEMENT_CONTENT_OR) ||
			    (cont->c1 == NULL) ||
			    (cont->c1->type != XML_ELEMENT_CONTENT_PCDATA)) {
			    xmlErrValid(ctxt, XML_DTD_MIXED_CORRUPT,
				    "Internal: MIXED struct corrupted\n",
				    NULL);
			    break;
			}
			cont = cont->c2;
		    }
		    if (cont == NULL) {
			xmlErrValidNode(ctxt, elem, XML_DTD_INVALID_CHILD,
	       "Element %s is not declared in %s list of possible children\n",
			       name, elem->name, NULL);
			ret = 0;
		    }
		}
child_ok:
	        child = child->next;
	    }
	    break;
        case XML_ELEMENT_TYPE_ELEMENT:
	    if ((doc->standalone == 1) && (extsubset == 1)) {
		/*
		 * VC: Standalone Document Declaration
		 *     - element types with element content, if white space
		 *       occurs directly within any instance of those types.
		 */
		child = elem->children;
		while (child != NULL) {
		    if (child->type == XML_TEXT_NODE) {
			const xmlChar *content = child->content;

			while (IS_BLANK_CH(*content))
			    content++;
			if (*content == 0) {
			    xmlErrValidNode(ctxt, elem,
			                    XML_DTD_STANDALONE_WHITE_SPACE,
"standalone: %s declared in the external subset contains white spaces nodes\n",
				   elem->name, NULL, NULL);
			    ret = 0;
			    break;
			}
		    }
		    child =child->next;
		}
	    }
	    child = elem->children;
	    cont = elemDecl->content;
	    tmp = xmlValidateElementContent(ctxt, child, elemDecl, 1, elem);
	    if (tmp <= 0)
		ret = tmp;
	    break;
    }
    } /* not continuous */

    /* [ VC: Required Attribute ] */
    attr = elemDecl->attributes;
    while (attr != NULL) {
	if (attr->def == XML_ATTRIBUTE_REQUIRED) {
	    int qualified = -1;

	    if ((attr->prefix == NULL) &&
		(xmlStrEqual(attr->name, BAD_CAST "xmlns"))) {
		xmlNsPtr ns;

		ns = elem->nsDef;
		while (ns != NULL) {
		    if (ns->prefix == NULL)
			goto found;
		    ns = ns->next;
		}
	    } else if (xmlStrEqual(attr->prefix, BAD_CAST "xmlns")) {
		xmlNsPtr ns;

		ns = elem->nsDef;
		while (ns != NULL) {
		    if (xmlStrEqual(attr->name, ns->prefix))
			goto found;
		    ns = ns->next;
		}
	    } else {
		xmlAttrPtr attrib;

		attrib = elem->properties;
		while (attrib != NULL) {
		    if (xmlStrEqual(attrib->name, attr->name)) {
			if (attr->prefix != NULL) {
			    xmlNsPtr nameSpace = attrib->ns;

			    if (nameSpace == NULL)
				nameSpace = elem->ns;
			    /*
			     * qualified names handling is problematic, having a
			     * different prefix should be possible but DTDs don't
			     * allow to define the URI instead of the prefix :-(
			     */
			    if (nameSpace == NULL) {
				if (qualified < 0)
				    qualified = 0;
			    } else if (!xmlStrEqual(nameSpace->prefix,
						    attr->prefix)) {
				if (qualified < 1)
				    qualified = 1;
			    } else
				goto found;
			} else {
			    /*
			     * We should allow applications to define namespaces
			     * for their application even if the DTD doesn't
			     * carry one, otherwise, basically we would always
			     * break.
			     */
			    goto found;
			}
		    }
		    attrib = attrib->next;
		}
	    }
	    if (qualified == -1) {
		if (attr->prefix == NULL) {
		    xmlErrValidNode(ctxt, elem, XML_DTD_MISSING_ATTRIBUTE,
		       "Element %s does not carry attribute %s\n",
			   elem->name, attr->name, NULL);
		    ret = 0;
	        } else {
		    xmlErrValidNode(ctxt, elem, XML_DTD_MISSING_ATTRIBUTE,
		       "Element %s does not carry attribute %s:%s\n",
			   elem->name, attr->prefix,attr->name);
		    ret = 0;
		}
	    } else if (qualified == 0) {
		xmlErrValidWarning(ctxt, elem, XML_DTD_NO_PREFIX,
		   "Element %s required attribute %s:%s has no prefix\n",
		       elem->name, attr->prefix, attr->name);
	    } else if (qualified == 1) {
		xmlErrValidWarning(ctxt, elem, XML_DTD_DIFFERENT_PREFIX,
		   "Element %s required attribute %s:%s has different prefix\n",
		       elem->name, attr->prefix, attr->name);
	    }
	} else if (attr->def == XML_ATTRIBUTE_FIXED) {
	    /*
	     * Special tests checking #FIXED namespace declarations
	     * have the right value since this is not done as an
	     * attribute checking
	     */
	    if ((attr->prefix == NULL) &&
		(xmlStrEqual(attr->name, BAD_CAST "xmlns"))) {
		xmlNsPtr ns;

		ns = elem->nsDef;
		while (ns != NULL) {
		    if (ns->prefix == NULL) {
			if (!xmlStrEqual(attr->defaultValue, ns->href)) {
			    xmlErrValidNode(ctxt, elem,
			           XML_DTD_ELEM_DEFAULT_NAMESPACE,
   "Element %s namespace name for default namespace does not match the DTD\n",
				   elem->name, NULL, NULL);
			    ret = 0;
			}
			goto found;
		    }
		    ns = ns->next;
		}
	    } else if (xmlStrEqual(attr->prefix, BAD_CAST "xmlns")) {
		xmlNsPtr ns;

		ns = elem->nsDef;
		while (ns != NULL) {
		    if (xmlStrEqual(attr->name, ns->prefix)) {
			if (!xmlStrEqual(attr->defaultValue, ns->href)) {
			    xmlErrValidNode(ctxt, elem, XML_DTD_ELEM_NAMESPACE,
		   "Element %s namespace name for %s does not match the DTD\n",
				   elem->name, ns->prefix, NULL);
			    ret = 0;
			}
			goto found;
		    }
		    ns = ns->next;
		}
	    }
	}
found:
        attr = attr->nexth;
    }
    return(ret);
}